

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

QStyleOptionComboBox * __thiscall
QComboBoxPrivateContainer::comboStyleOption
          (QStyleOptionComboBox *__return_storage_ptr__,QComboBoxPrivateContainer *this)

{
  memset(__return_storage_ptr__,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(__return_storage_ptr__);
  QStyleOption::initFrom((QStyleOption *)__return_storage_ptr__,&this->combo->super_QWidget);
  (__return_storage_ptr__->super_QStyleOptionComplex).subControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff;
  (__return_storage_ptr__->super_QStyleOptionComplex).activeSubControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  __return_storage_ptr__->editable =
       *(long *)(*(long *)&(this->combo->super_QWidget).field_0x8 + 0x2a0) != 0;
  return __return_storage_ptr__;
}

Assistant:

QStyleOptionComboBox QComboBoxPrivateContainer::comboStyleOption() const
{
    // ### This should use QComboBox's initStyleOption(), but it's protected
    // perhaps, we could cheat by having the QCombo private instead?
    QStyleOptionComboBox opt;
    opt.initFrom(combo);
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_None;
    opt.editable = combo->isEditable();
    return opt;
}